

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall Genome::Attach(Genome *this,Ptr *pol)

{
  int stop;
  element_type *this_00;
  shared_ptr<Transcript> local_68 [2];
  shared_ptr<Polymer> local_48;
  shared_ptr<MobileElement> local_38;
  undefined1 local_28 [8];
  Ptr transcript;
  Ptr *pol_local;
  Genome *this_local;
  
  transcript.super___shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pol;
  this_00 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)pol);
  stop = MobileElement::stop(this_00);
  BuildTranscript((Genome *)local_28,(int)this,stop);
  std::shared_ptr<MobileElement>::shared_ptr(&local_38,pol);
  std::shared_ptr<Polymer>::shared_ptr<Transcript,void>
            (&local_48,(shared_ptr<Transcript> *)local_28);
  MobileElementManager::Insert(&(this->super_Polymer).polymerases_,&local_38,&local_48);
  std::shared_ptr<Polymer>::~shared_ptr(&local_48);
  std::shared_ptr<MobileElement>::~shared_ptr(&local_38);
  std::shared_ptr<Transcript>::shared_ptr(local_68,(shared_ptr<Transcript> *)local_28);
  Signal<std::shared_ptr<Transcript>_>::Emit(&this->transcript_signal_,local_68);
  std::shared_ptr<Transcript>::~shared_ptr(local_68);
  std::shared_ptr<Transcript>::~shared_ptr((shared_ptr<Transcript> *)local_28);
  return;
}

Assistant:

void Genome::Attach(MobileElement::Ptr pol) {
  Transcript::Ptr transcript = BuildTranscript(pol->stop(), stop_);
  polymerases_.Insert(pol, transcript);
  transcript_signal_.Emit(transcript);
}